

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

void __thiscall
Wasm::WasmBytecodeGenerator::EmitReturnExpr
          (WasmBytecodeGenerator *this,PolymorphicEmitInfo *explicitRetInfo)

{
  IWasmByteCodeWriter *pIVar1;
  EmitInfoBase EVar2;
  OpCodeAsmJs OVar3;
  uint32 uVar4;
  uint uVar5;
  PolymorphicEmitInfo PVar6;
  EmitInfo EStack_34;
  OpCodeAsmJs retOp;
  EmitInfo info;
  uint32 i;
  PolymorphicEmitInfo retExprInfo;
  PolymorphicEmitInfo *explicitRetInfo_local;
  WasmBytecodeGenerator *this_local;
  
  if (explicitRetInfo == (PolymorphicEmitInfo *)0x0) {
    PVar6 = PopStackPolymorphic(this,this->m_funcBlock,(char16 *)0x0);
    stack0xffffffffffffffd8 = CONCAT44(i,PVar6.count);
  }
  else {
    unique0x00012000 = *(undefined8 *)explicitRetInfo;
  }
  info.super_EmitInfoBase.location = 0;
  while( true ) {
    EVar2.location = info.super_EmitInfoBase.location;
    uVar4 = PolymorphicEmitInfo::Count((PolymorphicEmitInfo *)&info.type);
    if (uVar4 <= EVar2.location) break;
    EStack_34 = PolymorphicEmitInfo::GetInfo
                          ((PolymorphicEmitInfo *)&info.type,info.super_EmitInfoBase.location);
    OVar3 = GetReturnOp(this,EStack_34.type);
    (*this->m_writer->_vptr_IWasmByteCodeWriter[8])
              (this->m_writer,(ulong)OVar3,0,(ulong)EStack_34 & 0xffffffff);
    ReleaseLocation(this,&stack0xffffffffffffffcc);
    info.super_EmitInfoBase.location = info.super_EmitInfoBase.location + 1;
  }
  pIVar1 = this->m_writer;
  uVar5 = WasmFunctionInfo::GetExitLabel(this->m_funcInfo);
  (*pIVar1->_vptr_IWasmByteCodeWriter[0x19])(pIVar1,(ulong)uVar5,0x25);
  SetUnreachableState(this,true);
  return;
}

Assistant:

void WasmBytecodeGenerator::EmitReturnExpr(PolymorphicEmitInfo* explicitRetInfo)
{
    PolymorphicEmitInfo retExprInfo = explicitRetInfo ? *explicitRetInfo : PopStackPolymorphic(m_funcBlock);
    for (uint32 i = 0; i < retExprInfo.Count(); ++i)
    {
        EmitInfo info = retExprInfo.GetInfo(i);
        Js::OpCodeAsmJs retOp = GetReturnOp(info.type);
        m_writer->Conv(retOp, 0, info.location);
        ReleaseLocation(&info);
    }
    m_writer->AsmBr(m_funcInfo->GetExitLabel());

    SetUnreachableState(true);
}